

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

void __thiscall Datetime::operator++(Datetime *this,int param_1)

{
  int y;
  int m;
  int d;
  int hr;
  int mi;
  int se;
  Datetime local_d8;
  Datetime local_a8;
  Datetime local_78;
  undefined1 local_48 [8];
  Datetime tomorrow;
  int param_1_local;
  Datetime *this_local;
  
  tomorrow._date._4_4_ = param_1;
  startOfDay(&local_a8,this);
  operator+(&local_78,&local_a8,0x15f91);
  startOfDay((Datetime *)local_48,&local_78);
  y = year((Datetime *)local_48);
  m = month((Datetime *)local_48);
  d = day((Datetime *)local_48);
  hr = hour(this);
  mi = minute(this);
  se = second(this);
  Datetime(&local_d8,y,m,d,hr,mi,se);
  memcpy(local_48,&local_d8,0x30);
  this->_date = tomorrow._32_8_;
  return;
}

Assistant:

void Datetime::operator++ (int)
{
  Datetime tomorrow = (startOfDay () + 90001).startOfDay ();
  tomorrow = Datetime (tomorrow.year (),
                       tomorrow.month (),
                       tomorrow.day (),
                       hour (),
                       minute (),
                       second ());
  _date = tomorrow._date;
}